

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O0

bool dg::DODRanganath::onallpaths(CDNode *from,CDNode *n,CDGraph *G)

{
  mapped_type *pmVar1;
  long in_RSI;
  long in_RDI;
  function<bool_(dg::CDNode_*,_dg::CDNode_*)> onallpths;
  unordered_map<dg::CDNode_*,_NodeInf,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>_>
  data;
  size_type in_stack_ffffffffffffff78;
  anon_class_16_2_1aa2e952 *__f;
  unordered_map<dg::CDNode_*,_NodeInf,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>_>
  *in_stack_ffffffffffffff80;
  CDNode *__args_1;
  CDNode *in_stack_ffffffffffffff88;
  function<bool_(dg::CDNode_*,_dg::CDNode_*)> *in_stack_ffffffffffffff90;
  anon_class_16_2_1aa2e952 local_58 [5];
  byte local_1;
  
  if (in_RDI == in_RSI) {
    local_1 = 1;
  }
  else {
    std::
    unordered_map<dg::CDNode_*,_NodeInf,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>_>
    ::unordered_map((unordered_map<dg::CDNode_*,_NodeInf,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>_>
                     *)0x1624c9);
    CDGraph::size((CDGraph *)0x1624d3);
    std::
    unordered_map<dg::CDNode_*,_NodeInf,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>_>
    ::reserve(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    __f = local_58;
    __args_1 = (CDNode *)&stack0xffffffffffffff88;
    std::function<bool(dg::CDNode*,dg::CDNode*)>::
    function<dg::DODRanganath::onallpaths(dg::CDNode*,dg::CDNode*,dg::CDGraph&)::_lambda(dg::CDNode*,dg::CDNode*)_1_,void>
              ((function<bool_(dg::CDNode_*,_dg::CDNode_*)> *)__args_1,__f);
    pmVar1 = std::
             unordered_map<dg::CDNode_*,_NodeInf,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>_>
             ::operator[]((unordered_map<dg::CDNode_*,_NodeInf,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>_>
                           *)__args_1,(key_type *)__f);
    pmVar1->onstack = true;
    local_1 = std::function<bool_(dg::CDNode_*,_dg::CDNode_*)>::operator()
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,__args_1);
    std::function<bool_(dg::CDNode_*,_dg::CDNode_*)>::~function
              ((function<bool_(dg::CDNode_*,_dg::CDNode_*)> *)0x162539);
    std::
    unordered_map<dg::CDNode_*,_NodeInf,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>_>
    ::~unordered_map((unordered_map<dg::CDNode_*,_NodeInf,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>_>
                      *)0x162543);
  }
  return (bool)(local_1 & 1);
}

Assistant:

static bool onallpaths(CDNode *from, CDNode *n, CDGraph &G) {
        if (from == n) // fast path
            return true;

        struct NodeInf {
            bool onstack{false};
            bool visited{false};
        };
        std::unordered_map<CDNode *, NodeInf> data;

        data.reserve(G.size());

        const std::function<bool(CDNode *, CDNode *)> onallpths =
                [&](CDNode *node, CDNode *target) -> bool {
            if (node == target)
                return true;

            data[node].visited = true;

            if (!node->hasSuccessors())
                return false;

            for (auto *s : node->successors()) {
                if (data[s].onstack)
                    return false;
                if (!data[s].visited) {
                    data[s].onstack = true;
                    if (!onallpths(s, target))
                        return false;
                    data[s].onstack = false;
                }
            }
            // if we have successors and got here,
            // then all successors reach target
            return true;
        };

        data[from].onstack = true;
        // DBG(tmp, "on all paths:" << from->getID() << ", " << n->getID() << ":
        // " << r );
        return onallpths(from, n);
    }